

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

ImVec2 InputTextCalcTextSizeW
                 (ImWchar *text_begin,ImWchar *text_end,ImWchar **remaining,ImVec2 *out_offset,
                 bool stop_on_new_line)

{
  float fVar1;
  uint uVar2;
  ImFont *pIVar3;
  ImVec2 IVar4;
  char cVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  pIVar3 = GImGui->Font;
  fVar1 = GImGui->FontSize;
  fVar9 = 0.0;
  fVar7 = 0.0;
  fVar8 = 0.0;
  do {
    if (text_end <= text_begin) break;
    uVar2 = *text_begin;
    if ((ulong)uVar2 == 0xd) {
LAB_002375e1:
      cVar5 = '\0';
    }
    else {
      if (uVar2 != 10) {
        pfVar6 = &pIVar3->FallbackAdvanceX;
        if ((int)uVar2 < (pIVar3->IndexAdvanceX).Size) {
          if ((int)uVar2 < 0) {
            __assert_fail("i >= 0 && i < Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.h"
                          ,0x68c,"const T &ImVector<float>::operator[](int) const [T = float]");
          }
          pfVar6 = (pIVar3->IndexAdvanceX).Data + uVar2;
        }
        fVar9 = fVar9 + *pfVar6 * (fVar1 / pIVar3->FontSize);
        goto LAB_002375e1;
      }
      fVar7 = (float)(~-(uint)(fVar9 <= fVar7) & (uint)fVar9 | -(uint)(fVar9 <= fVar7) & (uint)fVar7
                     );
      fVar8 = fVar8 + fVar1;
      fVar9 = 0.0;
      cVar5 = (char)out_offset;
    }
    text_begin = text_begin + 1;
  } while (cVar5 == '\0');
  if (remaining != (ImWchar **)0x0) {
    *remaining = text_begin;
  }
  if (fVar7 < fVar9) {
    fVar7 = fVar9;
  }
  if (fVar8 == 0.0 || 0.0 < fVar9) {
    fVar8 = fVar1 + fVar8;
  }
  IVar4.y = fVar8;
  IVar4.x = fVar7;
  return IVar4;
}

Assistant:

static ImVec2 InputTextCalcTextSizeW(const ImWchar* text_begin, const ImWchar* text_end, const ImWchar** remaining, ImVec2* out_offset, bool stop_on_new_line)
{
    ImGuiContext& g = *GImGui;
    ImFont* font = g.Font;
    const float line_height = g.FontSize;
    const float scale = line_height / font->FontSize;

    ImVec2 text_size = ImVec2(0, 0);
    float line_width = 0.0f;

    const ImWchar* s = text_begin;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)(*s++);
        if (c == '\n')
        {
            text_size.x = ImMax(text_size.x, line_width);
            text_size.y += line_height;
            line_width = 0.0f;
            if (stop_on_new_line)
                break;
            continue;
        }
        if (c == '\r')
            continue;

        const float char_width = font->GetCharAdvance((ImWchar)c) * scale;
        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (out_offset)
        *out_offset = ImVec2(line_width, text_size.y + line_height);  // offset allow for the possibility of sitting after a trailing \n

    if (line_width > 0 || text_size.y == 0.0f)                        // whereas size.y will ignore the trailing \n
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}